

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *pcVar1;
  undefined8 uStack_20;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar1 = "tcp != NULL";
    uStack_20 = 0x55;
LAB_00159b5b:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,uStack_20,pcVar1);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      pcVar1 = "nread == UV_EOF";
      uStack_20 = 0x5b;
      goto LAB_00159b5b;
    }
    puts("GOT EOF");
    uv_close((uv_handle_t *)tcp,close_cb);
  }
  else {
    bytes_received_done = bytes_received_done + nread;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &read_req);
  ASSERT(req->fs_type == UV_FS_READ);
  ASSERT(req->result >= 0);  /* FIXME(bnoordhuis) Check if requested size? */
  read_cb_count++;
  uv_fs_req_cleanup(req);
  if (read_cb_count == 1) {
    ASSERT(strcmp(buf, test_buf) == 0);
    r = uv_fs_ftruncate(loop, &ftruncate_req, open_req1.result, 7,
        ftruncate_cb);
  } else {
    ASSERT(strcmp(buf, "test-bu") == 0);
    r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  }
  ASSERT(r == 0);
}